

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this,TestCaseInfo *other)

{
  string *in_RSI;
  string *in_RDI;
  SourceLineInfo *this_00;
  SourceLineInfo *in_stack_ffffffffffffffa8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RSI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40,in_RSI + 0x40);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_ffffffffffffffb0,
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_ffffffffffffffa8);
  this_00 = (SourceLineInfo *)(in_RDI + 0x90);
  std::__cxx11::string::string((string *)this_00,in_RSI + 0x90);
  SourceLineInfo::SourceLineInfo(this_00,in_stack_ffffffffffffffa8);
  in_RDI[0xd8] = (string)((byte)in_RSI[0xd8] & 1);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( TestCaseInfo const& other )
    :   name( other.name ),
        className( other.className ),
        description( other.description ),
        tags( other.tags ),
        tagsAsString( other.tagsAsString ),
        lineInfo( other.lineInfo ),
        isHidden( other.isHidden )
    {}